

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  slot_type sVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined8 uVar22;
  ctrl_t *pcVar23;
  size_t sVar24;
  ctrl_t h;
  ulong uVar25;
  size_t i;
  FindInfo FVar26;
  probe_seq<16UL> local_40;
  
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::priv::(anonymous namespace)::BadFastHash, std::equal_to<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::priv::(anonymous namespace)::BadFastHash, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::priv::(anonymous namespace)::BadFastHash, std::equal_to<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::priv::(anonymous namespace)::BadFastHash, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar23 = pcVar4 + uVar3;
  if (pcVar23 + 1 != pcVar4) {
    uVar25 = 0;
    do {
      pcVar1 = pcVar4 + uVar25;
      cVar7 = pcVar1[1];
      cVar8 = pcVar1[2];
      cVar9 = pcVar1[3];
      cVar10 = pcVar1[4];
      cVar11 = pcVar1[5];
      cVar12 = pcVar1[6];
      cVar13 = pcVar1[7];
      cVar14 = pcVar1[8];
      cVar15 = pcVar1[9];
      cVar16 = pcVar1[10];
      cVar17 = pcVar1[0xb];
      cVar18 = pcVar1[0xc];
      cVar19 = pcVar1[0xd];
      cVar20 = pcVar1[0xe];
      cVar21 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar25);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      uVar25 = uVar25 + 0x10;
    } while (uVar3 + 1 != uVar25);
  }
  uVar22 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar23 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar23 + 9) = uVar22;
  *pcVar23 = -1;
  sVar24 = this->capacity_;
  if (sVar24 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        FVar26 = find_first_non_full(this,0);
        sVar24 = FVar26.offset;
        probe(&local_40,this,0);
        uVar25 = sVar24 - local_40.offset_;
        uVar3 = this->capacity_;
        probe(&local_40,this,0);
        if ((i - local_40.offset_ & this->capacity_ ^ uVar25 & uVar3) < 0x10) {
          h = '\0';
        }
        else {
          if (this->ctrl_[sVar24] == -2) {
            set_ctrl(this,sVar24,'\0');
            psVar5 = this->slots_;
            sVar6 = psVar5[i];
            psVar5[i] = psVar5[sVar24];
            psVar5[sVar24] = sVar6;
            i = i - 1;
            goto LAB_001208cc;
          }
          if (this->ctrl_[sVar24] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::priv::(anonymous namespace)::BadFastHash, std::equal_to<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::priv::(anonymous namespace)::BadFastHash, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                         );
          }
          set_ctrl(this,sVar24,'\0');
          this->slots_[sVar24] = this->slots_[i];
          h = -0x80;
        }
        set_ctrl(this,i,h);
      }
LAB_001208cc:
      i = i + 1;
      sVar24 = this->capacity_;
    } while (i != sVar24);
  }
  reset_growth_left(this,sVar24);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }